

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O0

size_t utf8spn(void *src,void *accept)

{
  size_t offset;
  char *a;
  size_t chars;
  char *s;
  void *accept_local;
  void *src_local;
  
  chars = 0;
  s = (char *)src;
  do {
    if (*s == '\0') {
      return chars;
    }
    offset = 0;
    a = (char *)accept;
    while (*a != '\0') {
      if ((((int)*a & 0xc0U) != 0x80) && (offset != 0)) {
        chars = chars + 1;
        s = s + offset;
        break;
      }
      if (*a == s[offset]) {
        offset = offset + 1;
        a = a + 1;
      }
      else {
        do {
          a = a + 1;
        } while (((int)*a & 0xc0U) == 0x80);
        offset = 0;
      }
    }
    if (*a == '\0') {
      return chars;
    }
  } while( true );
}

Assistant:

size_t utf8spn(const void *src, const void *accept) {
  const char *s = (const char *)src;
  size_t chars = 0;

  while ('\0' != *s) {
    const char *a = (const char *)accept;
    size_t offset = 0;

    while ('\0' != *a) {
      // checking that if *r is the start of a utf8 codepoint
      // (it is not 0b10xxxxxx) and we have successfully matched
      // a previous character (0 < offset) - we found a match
      if ((0x80 != (0xc0 & *a)) && (0 < offset)) {
        // found a match, so increment the number of utf8 codepoints
        // that have matched and stop checking whether any other utf8
        // codepoints in a match
        chars++;
        s += offset;
        break;
      } else {
        if (*a == s[offset]) {
          offset++;
          a++;
        } else {
          // a could be in the middle of an unmatching utf8 codepoint,
          // so we need to march it on to the next character beginning,
          do {
            a++;
          } while (0x80 == (0xc0 & *a));

          // reset offset too as we found a mismatch
          offset = 0;
        }
      }
    }

    // if a got to its terminating null byte, then we didn't find a match.
    // Return the current number of matched utf8 codepoints
    if ('\0' == *a) {
      return chars;
    }
  }

  return chars;
}